

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::Value::Value(Value *this,char *begin,char *end)

{
  char *pcVar1;
  int local_20;
  char *end_local;
  char *begin_local;
  Value *this_local;
  
  Comments::Comments(&this->comments_);
  initBasic(this,stringValue,true);
  local_20 = (int)end;
  pcVar1 = duplicateAndPrefixStringValue(begin,local_20 - (int)begin);
  (this->value_).string_ = pcVar1;
  return;
}

Assistant:

Value::Value(const char* begin, const char* end) {
  initBasic(stringValue, true);
  value_.string_ =
      duplicateAndPrefixStringValue(begin, static_cast<unsigned>(end - begin));
}